

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drm.c
# Opt level: O2

void demmt_nouveau_gem_pushbuf_data(mmt_nouveau_pushbuf_data *data,void *state)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar5 = (ulong)(data->data).len;
  if ((7 < uVar5) && (uVar3 = (ulong)*(uint *)(data + 1), uVar3 + 4 <= uVar5)) {
    uVar4 = (ulong)*(uint *)((long)&data[1].data.len + uVar3 + 2);
    uVar7 = uVar3 + uVar4 + 8;
    if (uVar7 <= uVar5) {
      uVar6 = (ulong)*(uint *)((long)&data[2].data.len + uVar4 + uVar3);
      if (uVar7 + uVar6 + 4 <= uVar5) {
        uVar5 = uVar3 / 0x28;
        uVar7 = uVar4 / 0x18;
        uVar6 = uVar6 / 0x1c;
        if (dump_decoded_ioctl_data != 0) {
          pcVar1 = colors->reset;
          pcVar2 = colors->num;
          if (indent_logs == 0) {
            fprintf(_stdout,
                    "LOG: %sDRM_NOUVEAU_GEM_PUSHBUF%s data, nr_buffers: %s%d%s, nr_relocs: %s%d%s, nr_push: %s%d%s\n"
                    ,colors->rname,pcVar1,pcVar2,uVar5,pcVar1,pcVar2,uVar6,pcVar1,pcVar2,uVar7,
                    pcVar1);
          }
          else {
            fprintf(_stdout,
                    "%64s%sDRM_NOUVEAU_GEM_PUSHBUF%s data, nr_buffers: %s%d%s, nr_relocs: %s%d%s, nr_push: %s%d%s\n"
                    ," ",colors->rname,pcVar1,pcVar2,uVar5,pcVar1,pcVar2,uVar6,pcVar1,pcVar2,uVar7,
                    pcVar1);
          }
          if (mmt_sync_fd != -1) {
            fflush(_stdout);
          }
        }
        demmt_nouveau_decode_gem_pushbuf_data
                  ((int)uVar5,(drm_nouveau_gem_pushbuf_bo *)((long)&data[1].data.len + 2),(int)uVar7
                   ,(drm_nouveau_gem_pushbuf_push *)((long)&data[2].data.len + uVar3),(int)uVar6,
                   (drm_nouveau_gem_pushbuf_reloc *)(&data[3].msg_type.msg_type + uVar4 + uVar3));
        return;
      }
    }
  }
  fprintf(_stdout,"ERROR: invalid mmt_nouveau_pushbuf_data %s\n","");
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  demmt_abort();
}

Assistant:

void demmt_nouveau_gem_pushbuf_data(struct mmt_nouveau_pushbuf_data *data, void *state)
{
	// compat code, mmt does not generate mmt_nouveau_pushbuf_data message anymore

	int minlen = sizeof(struct mmt_buf *);
	if (data->data.len < minlen)
	{
		mmt_error("invalid mmt_nouveau_pushbuf_data %s\n", "");
		demmt_abort();
	}
	uint64_t used = 0;
	struct mmt_buf *buffers_mmt_buf = (void *)&data->data.data;
	used += buffers_mmt_buf->len + sizeof(*buffers_mmt_buf);
	if (used > data->data.len)
	{
		mmt_error("invalid mmt_nouveau_pushbuf_data %s\n", "");
		demmt_abort();
	}

	struct drm_nouveau_gem_pushbuf_bo *buffers = (void *)&buffers_mmt_buf->data;
	struct mmt_buf *push_mmt_buf = ((void *)buffers) + buffers_mmt_buf->len;
	used += push_mmt_buf->len + sizeof(*push_mmt_buf);
	if (used > data->data.len)
	{
		mmt_error("invalid mmt_nouveau_pushbuf_data %s\n", "");
		demmt_abort();
	}

	struct drm_nouveau_gem_pushbuf_push *push = (void *)&push_mmt_buf->data;
	struct mmt_buf *relocs_mmt_buf = ((void *)push) + push_mmt_buf->len;
	used += relocs_mmt_buf->len + sizeof(*relocs_mmt_buf);
	if (used > data->data.len)
	{
		mmt_error("invalid mmt_nouveau_pushbuf_data %s\n", "");
		demmt_abort();
	}

	struct drm_nouveau_gem_pushbuf_reloc *relocs = (void *)&relocs_mmt_buf->data;

	int nr_buffers = buffers_mmt_buf->len / sizeof(buffers[0]);
	int nr_push = push_mmt_buf->len / sizeof(push[0]);
	int nr_relocs = relocs_mmt_buf->len / sizeof(relocs[0]);

	if (dump_decoded_ioctl_data)
	{
		mmt_log("%sDRM_NOUVEAU_GEM_PUSHBUF%s data, nr_buffers: %s%d%s, nr_relocs: %s%d%s, nr_push: %s%d%s\n",
				colors->rname, colors->reset, colors->num, nr_buffers, colors->reset,
				colors->num, nr_relocs, colors->reset, colors->num, nr_push, colors->reset);
	}

	demmt_nouveau_decode_gem_pushbuf_data(nr_buffers, buffers, nr_push, push, nr_relocs, relocs);
}